

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O0

Filereader * Filereader::getFilereader(HighsLogOptions *log_options,string *filename)

{
  bool bVar1;
  int iVar2;
  Filereader *pFVar3;
  string *in_RSI;
  string lower_case_extension;
  string extension;
  Filereader *reader;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string local_c8 [16];
  string *in_stack_ffffffffffffff48;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [32];
  Filereader *local_18;
  
  std::__cxx11::string::string(local_58,in_RSI);
  getFilenameExt(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_58);
  bVar1 = std::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_a8,(ulong)in_RSI);
    getFilenameExt(in_stack_ffffffffffffff48);
    std::__cxx11::string::operator=(local_38,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
  }
  std::__cxx11::string::string(local_c8,local_38);
  tolower((int)local_c8);
  iVar2 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar2 == 0) {
    pFVar3 = (Filereader *)operator_new(8);
    memset(pFVar3,0,8);
    FilereaderMps::FilereaderMps((FilereaderMps *)in_stack_ffffffffffffff00);
    local_18 = pFVar3;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar2 == 0) {
      pFVar3 = (Filereader *)operator_new(0x10);
      memset(pFVar3,0,0x10);
      FilereaderLp::FilereaderLp((FilereaderLp *)in_stack_ffffffffffffff00);
      local_18 = pFVar3;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_c8);
      if (iVar2 == 0) {
        pFVar3 = (Filereader *)operator_new(8);
        memset(pFVar3,0,8);
        FilereaderEms::FilereaderEms((FilereaderEms *)in_stack_ffffffffffffff00);
        local_18 = pFVar3;
      }
      else {
        local_18 = (Filereader *)0x0;
      }
    }
  }
  pFVar3 = local_18;
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_38);
  return pFVar3;
}

Assistant:

Filereader* Filereader::getFilereader(const HighsLogOptions& log_options,
                                      const std::string filename) {
  Filereader* reader;
  std::string extension = getFilenameExt(filename);
  if (extension == "gz") {
#ifdef ZLIB_FOUND
    extension = getFilenameExt(filename.substr(0, filename.size() - 3));
#else
    highsLogUser(log_options, HighsLogType::kError,
                 "HiGHS build without zlib support. Cannot read .gz file.\n",
                 filename.c_str());
    reader = NULL;
#endif
    //  } else if (extension == "zip") {
    // #ifdef ZLIB_FOUND
    //    extension = getFilenameExt(filename.substr(0, filename.size() - 4));
    // #else
    //    highsLogUser(log_options, HighsLogType::kError,
    //                 "HiGHS build without zlib support. Cannot read .zip
    //                 file.\n", filename.c_str());
    //    reader = NULL;
    // #endif
  }
  std::string lower_case_extension = extension;
  tolower(lower_case_extension);
  if (lower_case_extension.compare("mps") == 0) {
    reader = new FilereaderMps();
  } else if (lower_case_extension.compare("lp") == 0) {
    reader = new FilereaderLp();
  } else if (lower_case_extension.compare("ems") == 0) {
    reader = new FilereaderEms();
  } else {
    reader = NULL;
  }
  return reader;
}